

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::parse_multipart_boundary(string *content_type,string *boundary)

{
  long lVar1;
  string local_40 [32];
  
  lVar1 = std::__cxx11::string::find((char *)content_type,0x16e7bd);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)content_type);
    std::__cxx11::string::operator=((string *)boundary,local_40);
    std::__cxx11::string::~string(local_40);
  }
  return lVar1 != -1;
}

Assistant:

inline bool parse_multipart_boundary(const std::string& content_type, std::string& boundary)
{
    auto pos = content_type.find("boundary=");
    if (pos == std::string::npos) {
        return false;
    }

    boundary = content_type.substr(pos + 9);
    return true;
}